

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave-view.c
# Opt level: O0

void become_viewable(chunk_conflict *c,loc grid,player *p,_Bool close)

{
  _Bool _Var1;
  square_conflict *psVar2;
  loc_conflict grid_00;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  wchar_t yc;
  wchar_t xc;
  wchar_t y;
  wchar_t x;
  _Bool close_local;
  player *p_local;
  chunk_conflict *c_local;
  loc grid_local;
  
  c_local._0_4_ = grid.x;
  c_local._4_4_ = grid.y;
  _Var1 = square_isview((chunk *)c,(loc_conflict)grid);
  if (!_Var1) {
    psVar2 = square((chunk *)c,(loc_conflict)grid);
    flag_on_dbg(psVar2->info,3,6,"square(c, grid)->info","SQUARE_VIEW");
    if (close) {
      psVar2 = square((chunk *)c,(loc_conflict)grid);
      flag_on_dbg(psVar2->info,3,5,"square(c, grid)->info","SQUARE_SEEN");
      psVar2 = square((chunk *)c,(loc_conflict)grid);
      flag_on_dbg(psVar2->info,3,0x15,"square(c, grid)->info","SQUARE_CLOSE_PLAYER");
    }
    _Var1 = square_islit((chunk *)c,(loc_conflict)grid);
    if (_Var1) {
      _Var1 = square_allowslos((chunk *)c,(loc_conflict)grid);
      if (_Var1) {
        psVar2 = square((chunk *)c,(loc_conflict)grid);
        flag_on_dbg(psVar2->info,3,5,"square(c, grid)->info","SQUARE_SEEN");
      }
      else {
        if ((int)c_local < (p->grid).x) {
          local_40 = (int)c_local + 1;
        }
        else {
          if ((p->grid).x < (int)c_local) {
            local_44 = (int)c_local + -1;
          }
          else {
            local_44 = (int)c_local;
          }
          local_40 = local_44;
        }
        if (c_local._4_4_ < (p->grid).y) {
          local_48 = c_local._4_4_ + 1;
        }
        else {
          if ((p->grid).y < c_local._4_4_) {
            local_4c = c_local._4_4_ + -1;
          }
          else {
            local_4c = c_local._4_4_;
          }
          local_48 = local_4c;
        }
        grid_00 = (loc_conflict)loc(local_40,local_48);
        _Var1 = square_islit((chunk *)c,grid_00);
        if (_Var1) {
          psVar2 = square((chunk *)c,(loc_conflict)grid);
          flag_on_dbg(psVar2->info,3,5,"square(c, grid)->info","SQUARE_SEEN");
        }
      }
    }
  }
  return;
}

Assistant:

static void become_viewable(struct chunk *c, struct loc grid, struct player *p,
							bool close)
{
	int x = grid.x;
	int y = grid.y;

	/* Already viewable, nothing to do */
	if (square_isview(c, grid)) return;

	/* Add the grid to the view, make seen if it's close enough to the player */
	sqinfo_on(square(c, grid)->info, SQUARE_VIEW);
	if (close) {
		sqinfo_on(square(c, grid)->info, SQUARE_SEEN);
		sqinfo_on(square(c, grid)->info, SQUARE_CLOSE_PLAYER);
	}

	/* Mark lit grids, and walls near to them, as seen */
	if (square_islit(c, grid)) {
		if (!square_allowslos(c, grid)) {
			/* For walls, check for a lit grid closer to the player */
			int xc = (x < p->grid.x) ? (x + 1) : (x > p->grid.x) ? (x - 1) : x;
			int yc = (y < p->grid.y) ? (y + 1) : (y > p->grid.y) ? (y - 1) : y;
			if (square_islit(c, loc(xc, yc))) {
				sqinfo_on(square(c, grid)->info, SQUARE_SEEN);
			}
		} else {
			sqinfo_on(square(c, grid)->info, SQUARE_SEEN);
		}
	}
}